

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
opt_constructorInitializerList_Test::opt_constructorInitializerList_Test
          (opt_constructorInitializerList_Test *this)

{
  opt_constructorInitializerList_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__opt_constructorInitializerList_Test_0025bd98;
  return;
}

Assistant:

TEST(opt, constructorInitializerList)
{
  using wd = weekday;
  weekday_mask mask{wd{0}, wd{2}, wd{6}};
  opt<weekday_mask> o1{in_place, {wd{0}, wd{2}, wd{6}}};
  EXPECT_TRUE(o1);
  EXPECT_TRUE(o1.has_value());
  EXPECT_EQ(0b0100'0101, (*o1).mask());
  EXPECT_EQ(0b0100'0101, o1.value().mask());
  EXPECT_EQ(0b0100'0101, o1.value_or(weekday_mask{wd{0}, wd{1}, wd{3}}).mask());
}